

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int balance(BtCursor *pCur)

{
  void *pvVar1;
  byte bVar2;
  u8 uVar3;
  ushort uVar4;
  u32 uVar5;
  BtShared *pBVar6;
  u8 *puVar7;
  PgHdr *pPVar8;
  MemPage *pPg;
  u16 uVar9;
  ushort uVar10;
  ushort uVar11;
  Pgno PVar12;
  uint uVar13;
  undefined6 extraout_var;
  undefined1 *puVar14;
  ulong uVar15;
  ulong extraout_RAX;
  int iVar16;
  u16 *puVar17;
  undefined8 uVar18;
  u8 *puVar19;
  long lVar20;
  MemPage **ppMVar21;
  char cVar22;
  uint uVar23;
  int iNew;
  uint *puVar24;
  u8 *puVar25;
  ulong uVar26;
  ulong uVar27;
  undefined4 *puVar28;
  uint *puVar29;
  MemPage *pMVar30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  Pgno pgno;
  int iVar34;
  MemPage *pMVar35;
  u8 *puVar36;
  uint uVar37;
  int iVar38;
  long lVar39;
  long lVar40;
  ulong uVar41;
  long in_FS_OFFSET;
  bool bVar42;
  MemPage *apOld [3];
  int cntNew [5];
  int szNew [5];
  u8 abDone [5];
  MemPage *pNew;
  Pgno pgnoNew;
  Pgno aPgOrder [5];
  int cntOld [5];
  u16 aPgFlags [5];
  Pgno aPgno [5];
  u8 *apDiv [2];
  u8 aBalanceQuickSpace [13];
  Pgno local_274;
  MemPage *local_270;
  ulong local_268;
  ulong local_260;
  MemPage *local_258;
  ulong local_250;
  uint *local_248;
  char local_239;
  BtCursor *local_238;
  ulong local_230;
  MemPage *local_228;
  BtShared *local_220;
  ulong local_218;
  Pgno local_20c;
  u8 *local_208;
  MemPage *local_200;
  MemPage *local_1f8;
  MemPage *local_1f0;
  MemPage *local_1e8;
  u16 *local_1e0;
  ulong local_1d8;
  undefined1 local_1d0 [8];
  undefined8 local_1c8;
  undefined1 auStack_1ae [6];
  int local_1a8 [2];
  long local_1a0 [2];
  u16 *local_190;
  uint auStack_188 [6];
  char local_170 [8];
  MemPage *local_168;
  uint local_15c;
  void *local_158;
  void *local_150;
  MemPage *local_148 [3];
  long lStack_12e;
  u16 *local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  Pgno local_100;
  undefined4 uStack_fc;
  uint auStack_e8 [7];
  int aiStack_cc [9];
  ulong local_a8;
  long local_a0;
  uint *local_98;
  ulong local_90;
  u16 auStack_82 [5];
  uint auStack_78 [6];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_90 = (ulong)(pCur->pBt->usableSize * 2) / 3;
  cVar22 = pCur->iPage;
  local_158 = (void *)0x0;
  local_238 = pCur;
LAB_001409a1:
  pMVar30 = pCur->apPage[cVar22];
  if (cVar22 == '\0') {
    if (pMVar30->nOverflow == '\0') goto LAB_0014232a;
    local_148[0] = (MemPage *)0x0;
    local_1c8._0_4_ = 0;
    pBVar6 = pMVar30->pBt;
    PVar12 = sqlite3PagerWrite(pMVar30->pDbPage);
    if (PVar12 == 0) {
      iVar38 = allocateBtreePage(pBVar6,local_148,(Pgno *)(local_1d0 + 8),pMVar30->pgno,'\0');
      pMVar35 = local_148[0];
      local_208 = (u8 *)CONCAT44(local_208._4_4_,iVar38);
      copyNodeContent(pMVar30,local_148[0],(int *)&local_208);
      if (pBVar6->autoVacuum != '\0') {
        ptrmapPut(pBVar6,(Pgno)local_1c8,'\x05',pMVar30->pgno,(int *)&local_208);
      }
      PVar12 = (Pgno)local_208;
      if ((Pgno)local_208 == 0) {
        memcpy(pMVar35->aiOvfl,pMVar30->aiOvfl,(ulong)((uint)pMVar30->nOverflow * 2));
        memcpy(pMVar35->apOvfl,pMVar30->apOvfl,(ulong)pMVar30->nOverflow << 3);
        pMVar35->nOverflow = pMVar30->nOverflow;
        zeroPage(pMVar30,*pMVar35->aData & 0xfffffff7);
        *(Pgno *)(pMVar30->aData + (ulong)pMVar30->hdrOffset + 8) =
             (Pgno)local_1c8 >> 0x18 | ((Pgno)local_1c8 & 0xff0000) >> 8 |
             ((Pgno)local_1c8 & 0xff00) << 8 | (Pgno)local_1c8 << 0x18;
        pCur->apPage[1] = pMVar35;
        pCur->iPage = '\x01';
        pCur->ix = 0;
        pCur->aiIdx[0] = 0;
        PVar12 = 0;
        cVar22 = '\x01';
        goto LAB_001418d2;
      }
      pCur->apPage[1] = (MemPage *)0x0;
      if (pMVar35 != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(pMVar35->pDbPage);
      }
    }
    else {
      pCur->apPage[1] = (MemPage *)0x0;
    }
  }
  else {
    if ((pMVar30->nOverflow != '\0') || ((uint)local_90 < pMVar30->nFree)) {
      pMVar35 = pCur->apPage[(long)cVar22 + -1];
      uVar10 = pCur->aiIdx[(long)cVar22 + -1];
      local_239 = cVar22;
      PVar12 = sqlite3PagerWrite(pMVar35->pDbPage);
      if (PVar12 == 0) {
        local_228 = pMVar35;
        local_168 = pMVar30;
        if ((((pMVar30->intKeyLeaf != '\0') && (pMVar30->nOverflow == '\x01')) &&
            (pMVar30->aiOvfl[0] == pMVar30->nCell)) &&
           ((pMVar35->pgno != 1 && (pMVar35->nCell == uVar10)))) {
          if (pMVar30->aiOvfl[0] == 0) {
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1039a);
            pMVar30 = local_168;
            PVar12 = 0xb;
          }
          else {
            pBVar6 = pMVar30->pBt;
            PVar12 = allocateBtreePage(pBVar6,local_148,(Pgno *)(local_148 + 9),0,'\0');
            pMVar30 = local_168;
            if (PVar12 == 0) {
              puVar7 = local_168->apOvfl[0];
              local_208 = puVar7;
              uVar9 = (*local_168->xCellSize)(local_168,puVar7);
              pPg = local_148[0];
              local_260 = CONCAT44(local_260._4_4_,(int)CONCAT62(extraout_var,uVar9));
              local_1a8[0] = CONCAT22(local_1a8[0]._2_2_,uVar9);
              zeroPage(local_148[0],0xd);
              PVar12 = rebuildPage(pPg,1,&local_208,(u16 *)local_1a8);
              pMVar35 = local_228;
              pMVar30 = local_168;
              local_1c8._0_4_ = PVar12;
              if (PVar12 == 0) {
                pPg->nFree = ((short)pBVar6->usableSize - (pPg->cellOffset + (short)local_260)) - 2;
                if ((pBVar6->autoVacuum != '\0') &&
                   (ptrmapPut(pBVar6,local_100,'\x05',local_228->pgno,(int *)(local_1d0 + 8)),
                   pPg->minLocal < (ushort)local_260)) {
                  ptrmapPutOvflPtr(pPg,puVar7,(int *)(local_1d0 + 8));
                }
                uVar41 = (ulong)(CONCAT11(local_168->aCellIdx[(ulong)local_168->nCell * 2 + -2],
                                          local_168->aCellIdx[(ulong)local_168->nCell * 2 + -1]) &
                                local_168->maskPage);
                uVar33 = 0;
                puVar7 = local_168->aData + uVar41;
                puVar36 = local_168->aData + uVar41 + 2;
                do {
                  puVar25 = puVar36;
                  puVar19 = puVar7;
                  if (7 < uVar33) break;
                  uVar33 = uVar33 + 1;
                  puVar7 = puVar19 + 1;
                  puVar36 = puVar25 + 1;
                } while ((char)*puVar19 < '\0');
                lVar20 = 4;
                do {
                  uVar3 = puVar25[-1];
                  (&stack0xffffffffffffffbb)[lVar20] = uVar3;
                  lVar20 = lVar20 + 1;
                  if (-1 < (char)uVar3) break;
                  bVar42 = puVar25 < puVar19 + 10;
                  puVar25 = puVar25 + 1;
                } while (bVar42);
                if ((Pgno)local_1c8 == 0) {
                  insertCell(pMVar35,(uint)pMVar35->nCell,&stack0xffffffffffffffbb,(int)lVar20,
                             (u8 *)0x0,local_168->pgno,(int *)(local_1d0 + 8));
                }
                *(Pgno *)(pMVar35->aData + (ulong)pMVar35->hdrOffset + 8) =
                     local_100 >> 0x18 | (local_100 & 0xff0000) >> 8 | (local_100 & 0xff00) << 8 |
                     local_100 << 0x18;
                pMVar30 = local_168;
                PVar12 = (Pgno)local_1c8;
                if (pPg != (MemPage *)0x0) {
                  sqlite3PagerUnrefNotNull(pPg->pDbPage);
                  pMVar30 = local_168;
                  PVar12 = (Pgno)local_1c8;
                }
              }
            }
          }
          goto LAB_001418bc;
        }
        local_150 = pcache1Alloc(pCur->pBt->pageSize);
        local_170[0] = '\0';
        local_170[1] = '\0';
        local_170[2] = '\0';
        local_170[3] = '\0';
        local_170[4] = 0;
        local_208 = (u8 *)((ulong)local_208 & 0xffffffff00000000);
        local_1f8 = (MemPage *)0x0;
        if (local_150 != (void *)0x0) {
          uVar23 = pCur->hints & 1;
          local_108 = (ulong)uVar23;
          uVar37 = (uint)local_228->nCell + (uint)local_228->nOverflow;
          local_118 = 0;
          if (1 < uVar37) {
            uVar13 = (uint)uVar10;
            if (uVar13 == 0) {
              local_118 = 0;
            }
            else if (uVar37 == uVar13) {
              local_118 = (ulong)((uVar10 + uVar23) - 2);
            }
            else {
              local_118 = (ulong)(uVar13 - 1);
            }
            uVar37 = 2 - uVar23;
          }
          uVar41 = (ulong)uVar37;
          uVar23 = ((int)local_118 - (uint)local_228->nOverflow) + uVar37;
          if (uVar23 == local_228->nCell) {
            uVar33 = (ulong)local_228->hdrOffset + 8;
          }
          else {
            uVar33 = (ulong)(CONCAT11(local_228->aCellIdx[(long)(int)uVar23 * 2],
                                      local_228->aCellIdx[(long)(int)uVar23 * 2 + 1]) &
                            local_228->maskPage);
          }
          local_98 = (uint *)(local_228->aData + uVar33);
          pBVar6 = local_228->pBt;
          local_1d0._4_4_ = uVar37 + 1;
          uVar23 = *local_98;
          pgno = uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 | uVar23 << 0x18
          ;
          ppMVar21 = (MemPage **)((long)local_1a8 + (uVar41 * 4 + -0xd) * 2 + -6);
          PVar12 = getAndInitPage(pBVar6,pgno,ppMVar21,(BtCursor *)0x0,0);
          pMVar30 = local_228;
          uVar33 = (ulong)(uint)local_1d0._4_4_;
          uVar23 = local_1d0._4_4_;
          if (PVar12 == 0) {
            pMVar35 = *ppMVar21;
            iVar38 = (uint)pMVar35->nCell + (uint)pMVar35->nOverflow + 1;
            local_274 = PVar12;
            local_250 = uVar33;
            local_220 = pBVar6;
            local_218 = uVar41;
            local_110 = uVar41;
            if (uVar37 != 0) {
              local_258 = (MemPage *)(ulong)(((int)local_118 + uVar37) - 1);
              local_248 = auStack_188 + (uVar41 - 1);
              local_270 = (MemPage *)(&stack0xffffffffffffffa0 + uVar37 * 8);
              pMVar35 = (MemPage *)(local_1d0 + uVar37 * 8);
              uVar33 = 0;
              lVar20 = 0;
              local_230 = uVar41;
              local_1e8 = pMVar35;
              do {
                local_230 = local_230 - 1;
                iVar34 = (int)lVar20;
                if (pMVar30->nOverflow == 0) {
                  iVar16 = (int)local_258 + iVar34;
LAB_00140e53:
                  local_260 = CONCAT44(local_260._4_4_,iVar16);
                  puVar36 = pMVar30->aData;
                  lVar39 = (long)(int)(iVar16 - (uint)pMVar30->nOverflow);
                  uVar10 = CONCAT11(pMVar30->aCellIdx[lVar39 * 2],pMVar30->aCellIdx[lVar39 * 2 + 1])
                           & pMVar30->maskPage;
                  puVar7 = puVar36 + uVar10;
                  *(u8 **)(local_270->aiOvfl + lVar20 * 4 + -0xd) = puVar7;
                  local_1d8 = CONCAT44(local_1d8._4_4_,*(undefined4 *)(puVar36 + uVar10));
                  local_268 = uVar33;
                  uVar9 = (*pMVar30->xCellSize)(pMVar30,puVar7);
                  pvVar1 = local_150;
                  uVar23 = (uint)uVar9;
                  local_248[lVar20] = (uint)uVar9;
                  if ((local_220->btsFlags & 0xc) != 0) {
                    iVar16 = (int)puVar7 - *(int *)&pMVar30->aData;
                    if ((int)local_220->usableSize < (int)(iVar16 + uVar23)) {
                      uVar23 = 0;
                      PVar12 = 0xb;
                      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x104ef);
                      memset(local_1d0 + 8,0,local_268 + local_218 * 8);
                      pCur = local_238;
                      uVar33 = local_250;
                      goto LAB_00141832;
                    }
                    memcpy((void *)((long)local_150 + (long)iVar16),puVar7,(ulong)uVar23);
                    *(long *)(local_270->aiOvfl + lVar20 * 4 + -0xd) =
                         ((long)puVar7 - (long)pMVar30->aData) + (long)pvVar1;
                  }
                  pgno = (uint)local_1d8 >> 0x18 | ((uint)local_1d8 & 0xff0000) >> 8 |
                         ((uint)local_1d8 & 0xff00) << 8 | (uint)local_1d8 << 0x18;
                  dropCell(pMVar30,(int)local_260 - (uint)pMVar30->nOverflow,uVar23,
                           (int *)&local_274);
                  uVar33 = local_268;
                  pMVar35 = local_1e8;
                }
                else {
                  if ((int)local_258 + iVar34 != (uint)pMVar30->aiOvfl[0]) {
                    iVar16 = (int)local_118 + (int)local_230;
                    goto LAB_00140e53;
                  }
                  puVar29 = (uint *)pMVar30->apOvfl[0];
                  *(uint **)(local_270->aiOvfl + lVar20 * 4 + -0xd) = puVar29;
                  uVar23 = *puVar29;
                  pgno = uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 |
                         uVar23 << 0x18;
                  uVar9 = (*pMVar30->xCellSize)(pMVar30,(u8 *)puVar29);
                  local_248[lVar20] = (uint)uVar9;
                  pMVar30->nOverflow = '\0';
                }
                PVar12 = getAndInitPage(local_220,pgno,
                                        (MemPage **)((long)pMVar35->aiOvfl + (uVar33 - 0x1a)),
                                        (BtCursor *)0x0,0);
                if (PVar12 != 0) {
                  uVar33 = local_250;
                  uVar23 = (int)local_218 + iVar34;
                  goto LAB_00140d37;
                }
                iVar38 = iVar38 + (uint)*(ushort *)
                                         (*(long *)(pMVar35->aiOvfl + lVar20 * 4 + -0xd) + 0x16) +
                         (uint)*(byte *)(*(long *)(pMVar35->aiOvfl + lVar20 * 4 + -0xd) + 0xc) + 1;
                uVar33 = uVar33 - 8;
                lVar39 = lVar20 + -1;
                lVar20 = lVar20 + -1;
                local_274 = PVar12;
              } while (local_218 + lVar39 != 0);
            }
            uVar23 = iVar38 + 3U & 0xfffffffc;
            local_20c = pgno;
            local_1f8 = (MemPage *)sqlite3ScratchMalloc(uVar23 * 10 + local_220->pageSize);
            uVar33 = local_250;
            if (local_1f8 == (MemPage *)0x0) {
              uVar23 = 0;
              PVar12 = 7;
              pCur = local_238;
            }
            else {
              local_a0 = (long)(int)uVar23;
              local_270 = (MemPage *)(local_1f8->aiOvfl + local_a0 * 4 + -0xd);
              local_1e0 = local_270->aiOvfl + local_a0 + -0xd;
              local_200 = (MemPage *)CONCAT44(local_1c8._4_4_,(Pgno)local_1c8);
              local_15c = (uint)local_200->leaf;
              local_248 = (uint *)((ulong)local_200->leaf << 2);
              local_230 = (ulong)local_200->intKeyLeaf;
              local_190 = local_1f8->aiOvfl + local_a0 * 5 + -0xd;
              uVar41 = 0;
              iVar34 = 0;
              iVar38 = 0;
              local_1d8 = CONCAT44(local_1d8._4_4_,pgno);
              local_258 = local_1f8;
              local_1f0 = local_270;
              local_1e8 = local_200;
              do {
                lVar20 = *(long *)((long)local_1a8 + (uVar41 * 4 + -0xd) * 2 + -6);
                puVar7 = *(u8 **)(lVar20 + 0x50);
                if (*puVar7 != *local_1e8->aData) {
                  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10532);
                  pCur = local_238;
                  uVar23 = 0;
                  PVar12 = 0xb;
                  goto LAB_00141832;
                }
                uVar10 = *(ushort *)(lVar20 + 0x18);
                puVar36 = puVar7 + *(ushort *)(lVar20 + 0x12);
                lVar39 = (long)iVar38;
                local_268 = CONCAT44(local_268._4_4_,iVar38);
                local_260 = uVar41;
                memset(local_270->aiOvfl + lVar39 + -0xd,0,
                       (ulong)(((uint)*(byte *)(lVar20 + 0xc) + (uint)*(ushort *)(lVar20 + 0x16)) *
                              2));
                uVar33 = local_250;
                bVar2 = *(byte *)(lVar20 + 0xc);
                if ((ulong)bVar2 == 0) {
                  iVar38 = (int)local_268;
                }
                else {
                  uVar11 = *(ushort *)(lVar20 + 0x1a);
                  if (uVar11 != 0) {
                    lVar40 = lVar39 << 0x20;
                    lVar32 = 0;
                    do {
                      *(u8 **)(local_258->aiOvfl + lVar39 * 4 + lVar32 * 2 + -0xd) =
                           puVar7 + (uVar10 & CONCAT11(puVar36[lVar32],puVar36[lVar32 + 1]));
                      lVar40 = lVar40 + 0x100000000;
                      lVar32 = lVar32 + 2;
                    } while ((uint)uVar11 * 2 != (int)lVar32);
                    lVar39 = lVar40 >> 0x20;
                    puVar36 = puVar36 + lVar32;
                  }
                  uVar41 = 0;
                  do {
                    *(undefined8 *)(local_258->aiOvfl + lVar39 * 4 + uVar41 * 4 + -0xd) =
                         *(undefined8 *)(lVar20 + 0x28 + uVar41 * 8);
                    uVar41 = uVar41 + 1;
                  } while (bVar2 != uVar41);
                  iVar38 = (int)lVar39 + (int)uVar41;
                  local_208 = (u8 *)CONCAT44(local_208._4_4_,iVar38);
                }
                uVar11 = *(ushort *)(lVar20 + 0x12);
                uVar4 = *(ushort *)(lVar20 + 0x16);
                if (puVar36 < puVar7 + (ulong)uVar4 * 2 + (ulong)uVar11) {
                  lVar39 = (long)iVar38;
                  lVar32 = 0;
                  do {
                    puVar25 = puVar36 + lVar32;
                    *(u8 **)(local_258->aiOvfl + lVar39 * 4 + lVar32 * 2 + -0xd) =
                         puVar7 + (CONCAT11(*puVar25,puVar25[1]) & uVar10);
                    iVar38 = iVar38 + 1;
                    local_208 = (u8 *)CONCAT44(local_208._4_4_,iVar38);
                    lVar32 = lVar32 + 2;
                  } while (puVar25 + 2 < puVar7 + (ulong)uVar4 * 2 + (ulong)uVar11);
                }
                *(int *)((long)local_148 + local_260 * 4 + 0x80) = iVar38;
                if ((local_260 < local_218) && ((char)local_230 == '\0')) {
                  uVar23 = auStack_188[local_260] & 0xffff;
                  lVar39 = (long)iVar38;
                  local_270->aiOvfl[lVar39 + -0xd] = (u16)auStack_188[local_260];
                  pvVar1 = (void *)((long)local_1e0 + (long)iVar34);
                  iVar34 = iVar34 + uVar23;
                  memcpy(pvVar1,*(void **)(&stack0xffffffffffffffa8 + local_260 * 8),(ulong)uVar23);
                  puVar28 = (undefined4 *)((long)pvVar1 + (long)local_248);
                  *(undefined4 **)(local_258->aiOvfl + lVar39 * 4 + -0xd) = puVar28;
                  uVar10 = local_270->aiOvfl[lVar39 + -0xd] - (short)local_248;
                  local_270->aiOvfl[lVar39 + -0xd] = uVar10;
                  if (*(char *)(lVar20 + 8) == '\0') {
                    *puVar28 = *(undefined4 *)(*(long *)(lVar20 + 0x50) + 8);
                  }
                  else if (uVar10 < 4) {
                    puVar14 = (undefined1 *)((long)iVar34 + (long)local_190);
                    do {
                      *puVar14 = 0;
                      uVar10 = local_270->aiOvfl[lVar39 + -0xd] + 1;
                      local_270->aiOvfl[lVar39 + -0xd] = uVar10;
                      puVar14 = puVar14 + 1;
                      iVar34 = iVar34 + 1;
                    } while (uVar10 < 4);
                  }
                  iVar38 = iVar38 + 1;
                  local_208 = (u8 *)CONCAT44(local_208._4_4_,iVar38);
                }
                uVar41 = local_260 + 1;
              } while (uVar41 != uVar33);
              local_268 = CONCAT44(local_268._4_4_,iVar38);
              local_a8 = (ulong)local_248 & 0xffff;
              local_260 = CONCAT44(local_260._4_4_,
                                   local_220->usableSize + (uint)(ushort)local_248 + -0xc);
              lVar20 = 0;
              do {
                lVar39 = *(long *)((long)local_1a8 + (lVar20 * 4 + -0xd) * 2 + -6);
                uVar23 = (int)local_260 - (uint)*(ushort *)(lVar39 + 0x14);
                auStack_188[lVar20] = uVar23;
                if (*(char *)(lVar39 + 0xc) != '\0') {
                  uVar41 = 0;
                  do {
                    uVar10 = (**(code **)(lVar39 + 0x78))(lVar39);
                    uVar23 = uVar23 + uVar10 + 2;
                    auStack_188[lVar20] = uVar23;
                    uVar41 = uVar41 + 1;
                  } while (uVar41 < *(byte *)(lVar39 + 0xc));
                }
                *(undefined4 *)((long)local_1a8 + (lVar20 * 2 + 3) * 2 + -6) =
                     *(undefined4 *)((long)local_148 + lVar20 * 4 + 0x80);
                lVar20 = lVar20 + 1;
              } while (lVar20 != local_250);
              uVar41 = local_268 & 0xffffffff;
              local_120 = (u16 *)(long)(int)local_268;
              local_1e0 = (u16 *)-(long)(int)local_268;
              puVar17 = (u16 *)(ulong)(uint)local_1d0._4_4_;
              puVar29 = (uint *)0x0;
              pMVar30 = local_270;
              uVar33 = local_250;
              do {
                uVar23 = auStack_188[(long)puVar29];
                if ((int)local_260 < (int)uVar23) {
                  puVar24 = (uint *)((long)puVar29 + 1);
                  local_248 = puVar24;
                  do {
                    if ((long)(int)puVar17 <= (long)puVar24) {
                      if ((uint *)0x3 < puVar29) {
                        auStack_188[(long)puVar29] = uVar23;
                        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1059f);
                        pCur = local_238;
                        uVar33 = local_250;
                        uVar23 = 0;
                        PVar12 = 0xb;
                        goto LAB_00141832;
                      }
                      auStack_188[(long)puVar29 + 1] = 0;
                      *(int *)((long)local_1a0 + (long)puVar29 * 4 + -4) = (int)uVar41;
                      puVar17 = (u16 *)(ulong)((int)puVar29 + 2);
                    }
                    iVar38 = *(int *)((long)local_1a0 + ((long)puVar29 - 1U) * 4 + -4);
                    lVar20 = (long)iVar38;
                    uVar31 = lVar20 - 1;
                    uVar10 = pMVar30->aiOvfl[lVar20 + -0xe];
                    if (uVar10 == 0) {
                      uVar10 = computeCellSize((CellArray *)&local_208,(int)uVar31);
                      uVar41 = local_268 & 0xffffffff;
                      puVar24 = local_248;
                      pMVar30 = local_270;
                    }
                    iVar34 = uVar10 + 2;
                    if (((int)local_230 == 0) && (iVar34 = 0, iVar38 < (int)uVar41)) {
                      uVar11 = pMVar30->aiOvfl[lVar20 + -0xd];
                      if (uVar11 == 0) {
                        uVar11 = computeCellSize((CellArray *)&local_208,iVar38);
                        uVar41 = local_268 & 0xffffffff;
                        puVar24 = local_248;
                        pMVar30 = local_270;
                      }
                      iVar34 = uVar11 + 2;
                    }
                    auStack_188[(long)puVar29 + 1] = auStack_188[(long)puVar29 + 1] + iVar34;
                    uVar23 = uVar23 - (uVar10 + 2);
                    *(int *)((long)local_1a0 + ((long)puVar29 - 1U) * 4 + -4) = (int)uVar31;
                    uVar33 = local_250;
                  } while ((int)local_260 < (int)uVar23);
                }
                else {
                  uVar31 = (ulong)*(uint *)((long)local_1a0 + ((long)puVar29 - 1U) * 4 + -4);
                  puVar24 = (uint *)((long)puVar29 + 1);
                }
                auStack_188[(long)puVar29] = uVar23;
                if ((int)uVar31 < (int)uVar41) {
                  local_190 = puVar17;
                  local_248 = puVar24;
                  lVar20 = (long)(int)uVar31;
                  do {
                    lVar39 = lVar20 + 1;
                    uVar10 = pMVar30->aiOvfl[lVar20 + -0xd];
                    iVar38 = (int)uVar31;
                    if (uVar10 == 0) {
                      uVar10 = computeCellSize((CellArray *)&local_208,iVar38);
                      uVar41 = local_268 & 0xffffffff;
                      puVar17 = local_190;
                      puVar24 = local_248;
                      pMVar30 = local_270;
                    }
                    uVar23 = uVar23 + uVar10 + 2;
                    if ((int)local_260 < (int)uVar23) {
                      if (puVar29 == (uint *)0x0) {
                        iVar34 = 0;
                      }
                      else {
                        iVar34 = *(int *)((long)local_1a8 + ((long)puVar29 * 2 + 1) * 2 + -6);
                      }
                      if (iVar34 < iVar38) goto LAB_00141557;
                      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x105c0);
                      pCur = local_238;
                      uVar23 = 0;
                      PVar12 = 0xb;
                      goto LAB_00141832;
                    }
                    uVar37 = iVar38 + 1;
                    uVar31 = (ulong)uVar37;
                    auStack_188[(long)puVar29] = uVar23;
                    *(uint *)((long)local_1a0 + ((long)puVar29 - 1U) * 4 + -4) = uVar37;
                    if ((int)local_230 == 0) {
                      iVar38 = 0;
                      if (lVar39 < (long)local_120) {
                        uVar10 = pMVar30->aiOvfl[lVar20 + -0xc];
                        if (uVar10 == 0) {
                          uVar10 = computeCellSize((CellArray *)&local_208,uVar37);
                          uVar41 = local_268 & 0xffffffff;
                          puVar17 = local_190;
                          puVar24 = local_248;
                          pMVar30 = local_270;
                        }
                        goto LAB_00141515;
                      }
                    }
                    else {
LAB_00141515:
                      iVar38 = uVar10 + 2;
                    }
                    auStack_188[(long)puVar24] = auStack_188[(long)puVar24] - iVar38;
                    lVar20 = lVar39;
                  } while ((long)local_1e0 + lVar39 != 0);
                }
                puVar17 = (u16 *)((ulong)puVar24 & 0xffffffff);
LAB_00141557:
                puVar29 = puVar24;
              } while ((long)puVar24 < (long)(int)puVar17);
              local_190 = puVar17;
              local_120 = (u16 *)(ulong)((int)puVar17 - 1);
              local_258 = (MemPage *)
                          ((long)local_258 + (local_a0 * 8 - (ulong)(uint)((int)local_230 * 2)));
              puVar17 = local_120;
              do {
                pCur = local_238;
                if ((int)puVar17 < 1) {
                  local_270 = (MemPage *)CONCAT44(local_270._4_4_,(uint)*local_1e8->aData);
                  if ((int)local_190 < 1) {
                    uVar23 = 0;
                    local_1e8 = (MemPage *)((ulong)local_1e8 & 0xffffffff00000000);
                    local_20c = (uint)local_1d8;
                    goto LAB_00141d41;
                  }
                  pMVar30 = (MemPage *)((ulong)local_190 & 0xffffffff);
                  uVar31 = 0;
                  uVar37 = 0;
                  local_258 = pMVar30;
                  goto LAB_00141a87;
                }
                uVar23 = auStack_188[(long)((long)puVar17 - 1)];
                uVar37 = auStack_188[(long)puVar17];
                iVar38 = *(int *)((long)local_1a8 + ((long)puVar17 * 2 + 1) * 2 + -6);
                lVar20 = (long)iVar38 - local_230;
                if (*(short *)((long)pMVar30 + lVar20 * 2) == 0) {
                  computeCellSize((CellArray *)&local_208,(int)lVar20);
                  uVar41 = local_268 & 0xffffffff;
                  pMVar30 = local_270;
                }
                local_248 = (uint *)(ulong)((uint)(puVar17 == local_120) * 2 - 2);
                lVar20 = (long)iVar38 + 1;
                local_1e0 = puVar17;
                do {
                  iVar34 = iVar38 + -1;
                  if (pMVar30->aiOvfl[lVar20 + -0xf] == 0) {
                    computeCellSize((CellArray *)&local_208,iVar34);
                    uVar41 = local_268 & 0xffffffff;
                    pMVar30 = local_270;
                  }
                  if (uVar37 == 0) {
                    uVar10 = pMVar30->aiOvfl[lVar20 + -0xf];
                    uVar13 = local_258->aiOvfl[lVar20 + -0xe] + 2;
                  }
                  else {
                    if ((char)local_108 != '\0') break;
                    uVar13 = local_258->aiOvfl[lVar20 + -0xe] + uVar37 + 2;
                    uVar10 = pMVar30->aiOvfl[lVar20 + -0xf];
                    if ((int)(((int)local_248 + uVar23) - (uint)uVar10) < (int)uVar13) break;
                  }
                  uVar23 = (uVar23 - uVar10) - 2;
                  *(int *)((long)local_1a0 + (long)(puVar17 + -1) * 4 + -4) = iVar34;
                  lVar20 = lVar20 + -1;
                  uVar37 = uVar13;
                  iVar38 = iVar34;
                } while (1 < lVar20);
                auStack_188[(long)local_1e0] = uVar37;
                auStack_188[(long)((long)(puVar17 + -1) + 1)] = uVar23;
                iVar34 = 0;
                if (local_1e0 != (u16 *)0x1) {
                  iVar34 = *(int *)((long)local_1a8 + ((ulong)((int)local_1e0 - 2) * 2 + 3) * 2 + -6
                                   );
                }
                puVar17 = (u16 *)((long)puVar17 - 1);
                uVar33 = local_250;
              } while (iVar34 < iVar38);
              uVar23 = 0;
              uVar18 = 0x105ea;
              pCur = local_238;
LAB_00141714:
              uVar33 = local_250;
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar18);
              PVar12 = 0xb;
            }
          }
          else {
LAB_00140d37:
            pCur = local_238;
            local_274 = PVar12;
            memset(local_1d0 + 8,0,(long)(int)uVar23 << 3);
            uVar23 = 0;
          }
          goto LAB_00141832;
        }
        PVar12 = 7;
        goto LAB_0014189a;
      }
      goto LAB_001418bc;
    }
LAB_0014232a:
    PVar12 = 0;
  }
  goto LAB_00142358;
LAB_00141a87:
  do {
    pBVar6 = local_220;
    if (local_218 < uVar31) {
      PVar12 = 1;
      if ((char)local_108 == '\0') {
        PVar12 = local_20c;
      }
      local_274 = allocateBtreePage(local_220,local_148 + 9,&local_20c,PVar12,'\0');
      uVar33 = local_250;
      uVar23 = uVar37;
      PVar12 = local_274;
      if (local_274 != 0) goto LAB_00141832;
      pMVar35 = (MemPage *)CONCAT44(uStack_fc,local_100);
      zeroPage(pMVar35,(int)local_270);
      *(MemPage **)((long)local_148 + (uVar31 * 4 + -0xd) * 2 + 0x1a) = pMVar35;
      uVar23 = uVar37 + 1;
      uVar41 = local_268 & 0xffffffff;
      *(int *)((long)local_148 + uVar31 * 4 + 0x80) = (int)local_268;
      pMVar30 = local_258;
      if (pBVar6->autoVacuum != '\0') {
        ptrmapPut(pBVar6,pMVar35->pgno,'\x05',local_228->pgno,(int *)&local_274);
        uVar41 = local_268 & 0xffffffff;
        pMVar30 = local_258;
        uVar33 = local_250;
        PVar12 = local_274;
        if (local_274 != 0) goto LAB_00141832;
      }
    }
    else {
      lVar20 = *(long *)((long)local_1a8 + (uVar31 * 4 + -0xd) * 2 + -6);
      *(long *)((long)local_148 + (uVar31 * 4 + -0xd) * 2 + 0x1a) = lVar20;
      *(undefined8 *)((long)local_1a8 + (uVar31 * 4 + -0xd) * 2 + -6) = 0;
      local_274 = sqlite3PagerWrite(*(PgHdr **)(lVar20 + 0x70));
      uVar23 = uVar37 + 1;
      uVar33 = local_250;
      PVar12 = local_274;
      if (local_274 != 0) goto LAB_00141832;
      uVar41 = local_268 & 0xffffffff;
    }
    uVar23 = uVar37 + 1;
    uVar31 = uVar31 + 1;
    uVar37 = uVar23;
  } while (pMVar30 != (MemPage *)uVar31);
  if ((int)uVar23 < 1) {
    local_1e8 = (MemPage *)((ulong)local_1e8 & 0xffffffff00000000);
    uVar33 = local_250;
  }
  else {
    uVar31 = (ulong)uVar23;
    uVar33 = 0;
    do {
      lVar20 = *(long *)((long)local_148 + (uVar33 * 4 + -0xd) * 2 + 0x1a);
      uVar37 = *(uint *)(lVar20 + 4);
      auStack_78[uVar33] = uVar37;
      *(uint *)((long)local_148 + uVar33 * 4 + 0x60) = uVar37;
      auStack_82[uVar33] = *(u16 *)(*(long *)(lVar20 + 0x70) + 0x34);
      if (uVar33 != 0) {
        uVar26 = 0;
        do {
          if (auStack_78[uVar26] == uVar37) {
            uVar18 = 0x10634;
            goto LAB_00141714;
          }
          uVar26 = uVar26 + 1;
        } while (uVar33 != uVar26);
      }
      uVar33 = uVar33 + 1;
    } while (uVar33 != uVar31);
    uVar33 = 0;
    do {
      uVar26 = 0;
      if (uVar23 != 1) {
        uVar15 = 1;
        uVar27 = 0;
        do {
          uVar26 = uVar15 & 0xffffffff;
          if (*(uint *)((long)local_148 + (long)(int)uVar27 * 4 + 0x60) <=
              *(uint *)((long)local_148 + uVar15 * 4 + 0x60)) {
            uVar26 = uVar27;
          }
          uVar15 = uVar15 + 1;
          uVar27 = uVar26;
        } while (uVar31 != uVar15);
      }
      lVar20 = (long)(int)uVar26;
      PVar12 = *(Pgno *)((long)local_148 + lVar20 * 4 + 0x60);
      *(undefined4 *)((long)local_148 + lVar20 * 4 + 0x60) = 0xffffffff;
      if (uVar33 != uVar26) {
        if ((long)uVar33 < lVar20) {
          pPVar8 = *(PgHdr **)(*(long *)((long)local_148 + (lVar20 * 4 + -0xd) * 2 + 0x1a) + 0x70);
          uVar5 = local_220->nPage;
          pPVar8->flags = 0;
          sqlite3PcacheMove(pPVar8,(int)uVar26 + uVar5 + 1);
        }
        lVar39 = *(long *)((long)local_148 + (uVar33 * 4 + -0xd) * 2 + 0x1a);
        pPVar8 = *(PgHdr **)(lVar39 + 0x70);
        pPVar8->flags = auStack_82[lVar20];
        sqlite3PcacheMove(pPVar8,PVar12);
        *(Pgno *)(lVar39 + 4) = PVar12;
        uVar41 = local_268 & 0xffffffff;
        uVar26 = extraout_RAX;
      }
      uVar33 = uVar33 + 1;
    } while (uVar33 != uVar31);
    local_1e8 = (MemPage *)CONCAT44(local_1e8._4_4_,(int)CONCAT71((int7)(uVar26 >> 8),1));
    uVar33 = local_250;
    local_20c = PVar12;
  }
LAB_00141d41:
  local_1e0 = (u16 *)(long)(int)uVar23;
  lVar20 = local_1a0[(long)(local_1e0 + 5)];
  uVar37 = *(uint *)(lVar20 + 4);
  *local_98 = uVar37 >> 0x18 | (uVar37 & 0xff0000) >> 8 | (uVar37 & 0xff00) << 8 | uVar37 << 0x18;
  if ((((ulong)local_270 & 8) == 0) && (local_1d0._4_4_ != uVar23)) {
    ppMVar21 = (MemPage **)(local_1d0 + 8);
    if ((int)local_1d0._4_4_ < (int)uVar23) {
      ppMVar21 = local_148;
    }
    *(undefined4 *)(*(long *)(lVar20 + 0x50) + 8) =
         *(undefined4 *)
          (*(long *)(*(long *)((long)ppMVar21 + (local_218 * 4 + -0xd) * 2 + 0x1a) + 0x50) + 8);
  }
  if ((local_220->autoVacuum != '\0') && (0 < (int)uVar41)) {
    local_218 = CONCAT44(local_218._4_4_,(uint)((int)local_230 == 0));
    local_1d8 = (ulong)(int)local_220->usableSize;
    uVar26 = (ulong)((uint)local_148[0]->nCell + (uint)local_148[0]->nOverflow);
    local_270 = (MemPage *)local_148[0]->aData;
    uVar31 = 0;
    iVar34 = 0;
    iVar38 = 0;
    pMVar30 = local_148[0];
    do {
      if (uVar31 == uVar26) {
        lVar20 = (long)iVar34;
        iVar34 = iVar34 + 1;
        ppMVar21 = (MemPage **)(local_1d0 + 8);
        if (iVar34 < (int)uVar23) {
          ppMVar21 = local_148;
        }
        lVar20 = *(long *)((long)ppMVar21 + (lVar20 * 4 + -9) * 2 + 0x1a);
        uVar26 = (ulong)((int)uVar26 + (int)local_218 + (uint)*(ushort *)(lVar20 + 0x16) +
                        (uint)*(byte *)(lVar20 + 0xc));
        local_270 = *(MemPage **)(lVar20 + 0x50);
      }
      pMVar35 = *(MemPage **)(local_1f8->aiOvfl + uVar31 * 4 + -0xd);
      lVar20 = (long)iVar38;
      if (uVar31 == *(uint *)((long)local_1a8 + (lVar20 * 2 + 3) * 2 + -6)) {
        iVar38 = iVar38 + 1;
        pMVar30 = *(MemPage **)((long)local_148 + (lVar20 * 4 + -9) * 2 + 0x1a);
        if ((int)local_230 != 0) goto LAB_00141e76;
      }
      else {
LAB_00141e76:
        if (((((int)uVar23 <= iVar34) || (pMVar30->pgno != auStack_78[iVar34])) ||
            (pMVar35 < local_270)) ||
           ((MemPage *)((long)local_270->aiOvfl + (local_1d8 - 0x1a)) <= pMVar35)) {
          if ((char)local_15c == '\0') {
            uVar37._0_1_ = pMVar35->isInit;
            uVar37._1_1_ = pMVar35->bBusy;
            uVar37._2_1_ = pMVar35->intKey;
            uVar37._3_1_ = pMVar35->intKeyLeaf;
            local_268 = CONCAT44(local_268._4_4_,iVar38);
            local_258 = pMVar30;
            ptrmapPut(local_220,
                      uVar37 >> 0x18 | (uVar37 & 0xff0000) >> 8 | (uVar37 & 0xff00) << 8 |
                      uVar37 << 0x18,'\x05',pMVar30->pgno,(int *)&local_274);
            pMVar30 = local_258;
            iVar38 = (int)local_268;
          }
          uVar10 = local_1f0->aiOvfl[uVar31 - 0xd];
          if (uVar10 == 0) {
            local_268 = CONCAT44(local_268._4_4_,(int)uVar26);
            local_258 = pMVar30;
            uVar10 = computeCellSize((CellArray *)&local_208,(int)uVar31);
            uVar26 = local_268 & 0xffffffff;
            pMVar30 = local_258;
          }
          if (pMVar30->minLocal < uVar10) {
            local_268 = CONCAT44(local_268._4_4_,(int)uVar26);
            ptrmapPutOvflPtr(pMVar30,&pMVar35->isInit,(int *)&local_274);
            uVar26 = local_268 & 0xffffffff;
          }
          pCur = local_238;
          PVar12 = local_274;
          if (local_274 != 0) goto LAB_00141832;
          uVar41 = (ulong)local_208 & 0xffffffff;
        }
      }
      uVar31 = uVar31 + 1;
    } while ((long)uVar31 < (long)(int)uVar41);
  }
  local_268 = CONCAT44(local_268._4_4_,(int)uVar41);
  if (1 < (int)uVar23) {
    local_270 = local_1f8;
    local_258 = local_1f0;
    local_1d8 = (ulong)(uVar23 - 1);
    local_218 = local_118 & 0xffffffff;
    uVar31 = 0;
    iVar38 = 0;
    do {
      lVar20 = *(long *)((long)local_148 + (uVar31 * 4 + -0xd) * 2 + 0x1a);
      lVar39 = (long)*(int *)((long)local_1a8 + (uVar31 * 2 + 3) * 2 + -6);
      puVar29 = *(uint **)(local_270->aiOvfl + lVar39 * 4 + -0xd);
      uVar37 = (uint)local_258->aiOvfl[lVar39 + -0xd] + (int)local_a8;
      puVar24 = (uint *)((long)local_150 + (long)iVar38);
      if (*(char *)(lVar20 + 8) == '\0') {
        *(uint *)(*(long *)(lVar20 + 0x50) + 8) = *puVar29;
      }
      else if ((int)local_230 == 0) {
        puVar29 = puVar29 + -1;
        if (local_258->aiOvfl[lVar39 + -0xd] == 4) {
          local_248 = puVar29;
          uVar9 = (*local_228->xCellSize)(local_228,(u8 *)puVar29);
          uVar37 = (uint)uVar9;
          puVar29 = local_248;
        }
      }
      else {
        (**(code **)(lVar20 + 0x80))
                  (lVar20,*(undefined8 *)(local_270->aiOvfl + lVar39 * 4 + -0x11),local_148 + 9);
        iVar34 = sqlite3PutVarint((uchar *)(puVar24 + 1),CONCAT44(uStack_fc,local_100));
        uVar37 = iVar34 + 4;
        puVar29 = puVar24;
        puVar24 = (uint *)0x0;
      }
      insertCell(local_228,(int)local_218 + (int)uVar31,(u8 *)puVar29,uVar37,(u8 *)puVar24,
                 *(Pgno *)(lVar20 + 4),(int *)&local_274);
      pCur = local_238;
      PVar12 = local_274;
      if (local_274 != 0) goto LAB_00141832;
      iVar38 = iVar38 + uVar37;
      uVar31 = uVar31 + 1;
      uVar41 = local_268 & 0xffffffff;
    } while (local_1d8 != uVar31);
  }
  uVar37 = 1 - uVar23;
  if ((int)uVar37 < (int)uVar23) {
    local_230 = CONCAT44(local_230._4_4_,(uint)((int)local_230 == 0));
    local_270 = (MemPage *)CONCAT44(local_270._4_4_,local_1a8[0]);
    iVar38 = uVar23 * 2 + -1;
    do {
      iVar34 = (int)uVar41;
      uVar13 = -uVar37;
      if (0 < (int)uVar37) {
        uVar13 = uVar37;
      }
      uVar31 = (ulong)uVar13;
      if (local_170[uVar31] == '\0') {
        if ((int)uVar37 < 0) {
          if (*(int *)((long)local_1a8 + ((long)(int)uVar13 * 2 + 1) * 2 + -6) <=
              *(int *)((long)local_148 + (long)(int)uVar13 * 4 + 0x7c)) goto LAB_00142135;
        }
        else {
          if (uVar37 == 0) {
            iNew = 0;
            iVar34 = 0;
            iVar16 = (int)local_270;
          }
          else {
LAB_00142135:
            if ((uint)local_110 < uVar13) {
              uVar41 = (ulong)(uVar13 - 1);
            }
            else {
              uVar41 = (ulong)(int)(uVar13 - 1);
              iVar34 = *(int *)((long)local_148 + uVar41 * 4 + 0x80) + (int)local_230;
            }
            iNew = *(int *)((long)local_1a8 + (uVar41 * 2 + 3) * 2 + -6) + (int)local_230;
            iVar16 = *(int *)((long)local_1a8 + (uVar31 * 2 + 3) * 2 + -6) - iNew;
          }
          pMVar30 = *(MemPage **)((long)local_148 + (uVar31 * 4 + -0xd) * 2 + 0x1a);
          PVar12 = editPage(pMVar30,iVar34,iNew,iVar16,(CellArray *)&local_208);
          pCur = local_238;
          uVar33 = local_250;
          if (PVar12 != 0) goto LAB_00141832;
          local_170[uVar31] = '\x01';
          pMVar30->nFree = (short)local_260 - (short)auStack_188[uVar31];
          uVar41 = local_268 & 0xffffffff;
        }
      }
      uVar37 = uVar37 + 1;
      iVar38 = iVar38 + -1;
    } while (iVar38 != 0);
  }
  pMVar30 = local_148[0];
  pBVar6 = local_220;
  pCur = local_238;
  local_274 = 0;
  if (((local_239 == '\x01') && (local_228->nCell == 0)) &&
     ((ushort)local_228->hdrOffset <= local_148[0]->nFree)) {
    local_274 = defragmentPage(local_148[0],-1);
    copyNodeContent(pMVar30,local_228,(int *)&local_274);
    pCur = local_238;
    uVar33 = local_250;
    PVar12 = local_274;
    if (local_274 == 0) {
      PVar12 = freePage2(pMVar30->pBt,pMVar30,pMVar30->pgno);
    }
  }
  else {
    uVar33 = local_250;
    PVar12 = 0;
    if (((byte)local_1e8 & (char)local_15c == '\0' & local_220->autoVacuum != '\0') == 1) {
      uVar41 = 0;
      do {
        lVar20 = *(long *)((long)local_148 + (uVar41 * 4 + -0xd) * 2 + 0x1a);
        uVar37 = *(uint *)(*(long *)(lVar20 + 0x50) + 8);
        ptrmapPut(pBVar6,uVar37 >> 0x18 | (uVar37 & 0xff0000) >> 8 | (uVar37 & 0xff00) << 8 |
                         uVar37 << 0x18,'\x05',*(Pgno *)(lVar20 + 4),(int *)&local_274);
        uVar41 = uVar41 + 1;
        uVar33 = local_250;
        PVar12 = local_274;
      } while (uVar23 != uVar41);
    }
  }
  iVar38 = (int)local_110;
  if ((int)uVar23 <= iVar38) {
    local_260 = (long)local_1a8 + ((long)local_1e0 * 4 + -0xd) * 2 + -6;
    lVar20 = 0;
    do {
      if (PVar12 == 0) {
        pMVar30 = *(MemPage **)(local_260 + (lVar20 * 4 + -0xd) * 2 + 0x1a);
        PVar12 = freePage2(pMVar30->pBt,pMVar30,pMVar30->pgno);
      }
      lVar20 = lVar20 + 1;
      uVar33 = local_250;
    } while ((iVar38 - uVar23) + 1 != (int)lVar20);
  }
LAB_00141832:
  sqlite3ScratchFree(local_1f8);
  lVar20 = 0;
  do {
    lVar39 = *(long *)((long)local_1a8 + (lVar20 * 4 + -0xd) * 2 + -6);
    if (lVar39 != 0) {
      sqlite3PagerUnrefNotNull(*(DbPage **)(lVar39 + 0x70));
    }
    pMVar30 = local_168;
    lVar20 = lVar20 + 1;
  } while (uVar33 != lVar20);
  if (0 < (int)uVar23) {
    uVar41 = 0;
    do {
      lVar20 = *(long *)((long)local_148 + (uVar41 * 4 + -0xd) * 2 + 0x1a);
      if (lVar20 != 0) {
        sqlite3PagerUnrefNotNull(*(DbPage **)(lVar20 + 0x70));
      }
      uVar41 = uVar41 + 1;
    } while (uVar23 != uVar41);
  }
LAB_0014189a:
  if (local_158 != (void *)0x0) {
    pcache1Free(local_158);
  }
  local_158 = local_150;
LAB_001418bc:
  pMVar30->nOverflow = '\0';
  sqlite3PagerUnrefNotNull(pMVar30->pDbPage);
  cVar22 = pCur->iPage + -1;
  pCur->iPage = cVar22;
LAB_001418d2:
  if (PVar12 != 0) {
LAB_00142358:
    if (local_158 != (void *)0x0) {
      pcache1Free(local_158);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
      __stack_chk_fail();
    }
    return PVar12;
  }
  goto LAB_001409a1;
}

Assistant:

static int balance(BtCursor *pCur){
  int rc = SQLITE_OK;
  const int nMin = pCur->pBt->usableSize * 2 / 3;
  u8 aBalanceQuickSpace[13];
  u8 *pFree = 0;

  VVA_ONLY( int balance_quick_called = 0 );
  VVA_ONLY( int balance_deeper_called = 0 );

  do {
    int iPage = pCur->iPage;
    MemPage *pPage = pCur->apPage[iPage];

    if( iPage==0 ){
      if( pPage->nOverflow ){
        /* The root page of the b-tree is overfull. In this case call the
        ** balance_deeper() function to create a new child for the root-page
        ** and copy the current contents of the root-page to it. The
        ** next iteration of the do-loop will balance the child page.
        */ 
        assert( balance_deeper_called==0 );
        VVA_ONLY( balance_deeper_called++ );
        rc = balance_deeper(pPage, &pCur->apPage[1]);
        if( rc==SQLITE_OK ){
          pCur->iPage = 1;
          pCur->ix = 0;
          pCur->aiIdx[0] = 0;
          assert( pCur->apPage[1]->nOverflow );
        }
      }else{
        break;
      }
    }else if( pPage->nOverflow==0 && pPage->nFree<=nMin ){
      break;
    }else{
      MemPage * const pParent = pCur->apPage[iPage-1];
      int const iIdx = pCur->aiIdx[iPage-1];

      rc = sqlite3PagerWrite(pParent->pDbPage);
      if( rc==SQLITE_OK ){
#ifndef SQLITE_OMIT_QUICKBALANCE
        if( pPage->intKeyLeaf
         && pPage->nOverflow==1
         && pPage->aiOvfl[0]==pPage->nCell
         && pParent->pgno!=1
         && pParent->nCell==iIdx
        ){
          /* Call balance_quick() to create a new sibling of pPage on which
          ** to store the overflow cell. balance_quick() inserts a new cell
          ** into pParent, which may cause pParent overflow. If this
          ** happens, the next iteration of the do-loop will balance pParent 
          ** use either balance_nonroot() or balance_deeper(). Until this
          ** happens, the overflow cell is stored in the aBalanceQuickSpace[]
          ** buffer. 
          **
          ** The purpose of the following assert() is to check that only a
          ** single call to balance_quick() is made for each call to this
          ** function. If this were not verified, a subtle bug involving reuse
          ** of the aBalanceQuickSpace[] might sneak in.
          */
          assert( balance_quick_called==0 ); 
          VVA_ONLY( balance_quick_called++ );
          rc = balance_quick(pParent, pPage, aBalanceQuickSpace);
        }else
#endif
        {
          /* In this case, call balance_nonroot() to redistribute cells
          ** between pPage and up to 2 of its sibling pages. This involves
          ** modifying the contents of pParent, which may cause pParent to
          ** become overfull or underfull. The next iteration of the do-loop
          ** will balance the parent page to correct this.
          ** 
          ** If the parent page becomes overfull, the overflow cell or cells
          ** are stored in the pSpace buffer allocated immediately below. 
          ** A subsequent iteration of the do-loop will deal with this by
          ** calling balance_nonroot() (balance_deeper() may be called first,
          ** but it doesn't deal with overflow cells - just moves them to a
          ** different page). Once this subsequent call to balance_nonroot() 
          ** has completed, it is safe to release the pSpace buffer used by
          ** the previous call, as the overflow cell data will have been 
          ** copied either into the body of a database page or into the new
          ** pSpace buffer passed to the latter call to balance_nonroot().
          */
          u8 *pSpace = sqlite3PageMalloc(pCur->pBt->pageSize);
          rc = balance_nonroot(pParent, iIdx, pSpace, iPage==1,
                               pCur->hints&BTREE_BULKLOAD);
          if( pFree ){
            /* If pFree is not NULL, it points to the pSpace buffer used 
            ** by a previous call to balance_nonroot(). Its contents are
            ** now stored either on real database pages or within the 
            ** new pSpace buffer, so it may be safely freed here. */
            sqlite3PageFree(pFree);
          }

          /* The pSpace buffer will be freed after the next call to
          ** balance_nonroot(), or just before this function returns, whichever
          ** comes first. */
          pFree = pSpace;
        }
      }

      pPage->nOverflow = 0;

      /* The next iteration of the do-loop balances the parent page. */
      releasePage(pPage);
      pCur->iPage--;
      assert( pCur->iPage>=0 );
    }
  }while( rc==SQLITE_OK );

  if( pFree ){
    sqlite3PageFree(pFree);
  }
  return rc;
}